

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

int close_connect_only(connectdata *conn,void *param)

{
  undefined1 *puVar1;
  int iVar2;
  
  iVar2 = 0;
  if (((*(long *)((long)param + 0x1198) == conn->connection_id) &&
      (iVar2 = 1, conn->data == (Curl_easy *)param)) &&
     (conn->data = (Curl_easy *)0x0, ((conn->bits).field_0x7 & 0x20) != 0)) {
    Curl_conncontrol(conn,1);
    puVar1 = &(conn->bits).field_0x7;
    *puVar1 = *puVar1 & 0xdf;
  }
  return iVar2;
}

Assistant:

static int close_connect_only(struct connectdata *conn, void *param)
{
  struct Curl_easy *data = param;

  if(data->state.lastconnect_id != conn->connection_id)
    return 0;

  if(conn->data != data)
    return 1;
  conn->data = NULL;

  if(!conn->bits.connect_only)
    return 1;

  connclose(conn, "Removing connect-only easy handle");
  conn->bits.connect_only = FALSE;

  return 1;
}